

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmObjDate::save_to_file(CVmObjDate *this,CVmFile *fp)

{
  vm_date_ext *pvVar1;
  CVmFile *in_RSI;
  CVmObjDate *in_RDI;
  vm_date_ext *ext;
  uint v;
  
  pvVar1 = get_ext(in_RDI);
  v = (uint)((ulong)pvVar1 >> 0x20);
  CVmFile::write_int4(in_RSI,v);
  CVmFile::write_uint4(in_RSI,v);
  return;
}

Assistant:

void CVmObjDate::save_to_file(VMG_ class CVmFile *fp)
{
    /* get our extension */
    vm_date_ext *ext = get_ext();

    /* write the extension data */
    fp->write_int4(ext->dayno);
    fp->write_uint4(ext->daytime);
}